

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O0

bool __thiscall DOMTest::testCharacterData(DOMTest *this,DOMDocument *document)

{
  int iVar1;
  DOMOperationType DVar2;
  long *plVar3;
  DOMNode *pDVar4;
  wchar16 *pwVar5;
  long lVar6;
  DOMDocument *pDVar7;
  DOMDocument *pDVar8;
  DOMDocument *pDVar9;
  XMLCh *pXVar10;
  DOMNode *pDVar11;
  DOMNode *pDVar12;
  DOMNode *pDVar13;
  ulong uVar14;
  DOMDocument *local_2078;
  DOMDocument *local_2060;
  DOMException *e_6;
  DOMNode *myimport;
  DOMNode *mycloned;
  void *myNull2;
  void *mydocument2;
  void *myNull;
  void *mySecond2;
  void *mySecond;
  void *myFirst2;
  void *myFirst;
  void *mydocument;
  XMLCh *userSecond;
  DOMDocument *userFirst;
  DOMCharacterData *userTest;
  DOMException *e_5;
  DOMException *e_4;
  DOMException *e_3;
  DOMException *e_2;
  DOMException *e_1;
  DOMException *e;
  DOMTest local_1f81;
  undefined8 uStack_1f80;
  DOMTest tests;
  XMLSize_t length;
  DOMNode *abc1;
  wchar16 local_1f68 [3];
  bool OK;
  XMLCh resetData [3999];
  DOMCharacterData *charData;
  DOMDocument *document_local;
  DOMTest *this_local;
  
  xercesc_4_0::XMLString::transcode
            ("dBodyLevel31",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar3 = (long *)(**(code **)(*(long *)document + 0x68))();
  plVar3 = (long *)(**(code **)(*plVar3 + 0x158))(plVar3,tempStr);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x10))(plVar3,0);
  pDVar4 = (DOMNode *)(**(code **)(*plVar3 + 0x38))();
  xercesc_4_0::XMLString::transcode
            ("dBodyLevel31\'sChildTextNode11",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))();
  iVar1 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  if (iVar1 != 0) {
    fprintf(_stderr,
            "Warning!!! DOMCharacterData\'s \'getData\' failed to work properly!\n This may corrupt other DOMCharacterData tests!!!*****\n"
           );
  }
  abc1._7_1_ = iVar1 == 0;
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))();
  xercesc_4_0::XMLString::copyString(local_1f68,pwVar5);
  xercesc_4_0::XMLString::transcode
            (" This is new data for this node",tempStr2,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))();
  xercesc_4_0::XMLString::copyString(tempStr,pwVar5);
  xercesc_4_0::XMLString::catString(tempStr,tempStr2);
  (**(code **)(*(long *)pDVar4 + 0x158))(pDVar4,tempStr2);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))();
  iVar1 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  if (iVar1 != 0) {
    fprintf(_stderr,"Warning!!! DOMCharacterData\'s \'appendData\' failed to work properly!\n");
    abc1._7_1_ = false;
  }
  xercesc_4_0::XMLString::transcode
            ("dBodyLevel",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x168))(pDVar4,10,100);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))();
  iVar1 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  if (iVar1 != 0) {
    fprintf(_stderr,"Warning!!! DOMCharacterData\'s \'deleteData\' failed to work properly!\n");
    abc1._7_1_ = false;
  }
  uStack_1f80 = 10;
  lVar6 = (**(code **)(*(long *)pDVar4 + 0x148))();
  if (lVar6 != 10) {
    fprintf(_stderr,"Warning!!! DOMCharacterData\'s \'getLength\' failed to work properly!\n");
    abc1._7_1_ = false;
  }
  xercesc_4_0::XMLString::transcode
            ("dBody\' This is data inserted into this node\'Level",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("\' This is data inserted into this node\'",tempStr2,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x160))(pDVar4,5,tempStr2);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))();
  iVar1 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  if (iVar1 != 0) {
    fprintf(_stderr,"Warning!!! DOMCharacterData\'s \'insertData\' failed to work properly!\n");
    abc1._7_1_ = false;
  }
  xercesc_4_0::XMLString::transcode
            ("dBody\' This is \' replacement data\'ted into this node\'Level",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("\' replacement data\'",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x170))(pDVar4,0xf,10,tempStr2);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))();
  iVar1 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  if (iVar1 != 0) {
    fprintf(_stderr,"Warning!!! DOMCharacterData\'s \'replaceData\' failed to work properly!\n");
    abc1._7_1_ = false;
  }
  xercesc_4_0::XMLString::transcode
            ("New data A123456789B123456789C123456789D123456789E123456789",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x178))(pDVar4,tempStr);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))();
  iVar1 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  if (iVar1 != 0) {
    fprintf(_stderr,"Warning!!! DOMCharacterData\'s \'setData\' failed to work properly!");
    abc1._7_1_ = false;
  }
  xercesc_4_0::XMLString::transcode
            ("123456789D123456789E123456789",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,0x1e);
  iVar1 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  if (iVar1 != 0) {
    fprintf(_stderr,"Warning!!! DOMCharacterData\'s \'substringData\' failed to work properly!\n");
    abc1._7_1_ = false;
  }
  xercesc_4_0::XMLString::transcode
            ("New data A123456789B12345",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
            );
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,0,0x19);
  iVar1 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  if (iVar1 != 0) {
    fprintf(_stderr,"Warning!!! DOMCharacterData\'s \'substringData\' failed to work properly!\n");
    abc1._7_1_ = false;
  }
  DOMTest(&local_1f81);
  (**(code **)(*(long *)pDVar4 + 0x168))(pDVar4,0xffffffffffffffff,5);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0x65);
  (**(code **)(*(long *)pDVar4 + 0x168))(pDVar4,100,5);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0x67);
  xercesc_4_0::XMLString::transcode
            ("Stuff inserted",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x160))(pDVar4,100,tempStr);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0x69);
  xercesc_4_0::XMLString::transcode
            ("Replacement stuff",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x170))(pDVar4,100,5,tempStr);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0x6b);
  (**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,0xffffffffffffffff,5);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0x6d);
  (**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,100,5);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0x6e);
  xercesc_4_0::XMLString::transcode
            ("first",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("document",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,document,0);
  pDVar7 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (document != pDVar7) {
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0x713);
    abc1._7_1_ = false;
  }
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,document,0);
  pDVar8 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (document != pDVar8) {
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0x71a);
    abc1._7_1_ = false;
  }
  pDVar8 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,tempStr2,0);
  pDVar9 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pDVar9 != (DOMDocument *)tempStr2) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x722);
    abc1._7_1_ = false;
  }
  if (document != pDVar8) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x726);
    abc1._7_1_ = false;
  }
  if (document == pDVar9) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x72a);
    abc1._7_1_ = false;
  }
  xercesc_4_0::XMLString::transcode
            ("not-exist",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr3);
  if (lVar6 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x732);
    abc1._7_1_ = false;
  }
  lVar6 = (**(code **)(*(long *)(document + 0x18) + 0xf0))(document + 0x18,tempStr);
  if (lVar6 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x738);
    abc1._7_1_ = false;
  }
  pXVar10 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,0);
  lVar6 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pXVar10 != tempStr2) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x740);
    abc1._7_1_ = false;
  }
  if (lVar6 != 0) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x744);
    abc1._7_1_ = false;
  }
  pDVar8 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,0);
  lVar6 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (pDVar7 != pDVar8) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x74b);
    abc1._7_1_ = false;
  }
  if (lVar6 != 0) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x74f);
    abc1._7_1_ = false;
  }
  lVar6 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (lVar6 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x755);
    abc1._7_1_ = false;
  }
  lVar6 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (lVar6 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x759);
    abc1._7_1_ = false;
  }
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,document,&userhandler);
  pDVar11 = (DOMNode *)(**(code **)(*(long *)pDVar4 + 0x68))(pDVar4,1);
  DVar2 = myUserDataHandler::getCurrentType(&userhandler);
  if (DVar2 != NODE_CLONED) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x761)
    ;
    abc1._7_1_ = false;
  }
  pXVar10 = myUserDataHandler::getCurrentKey(&userhandler);
  iVar1 = xercesc_4_0::XMLString::compareString(pXVar10,tempStr2);
  if (iVar1 != 0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x761);
    abc1._7_1_ = false;
  }
  pDVar7 = (DOMDocument *)myUserDataHandler::getCurrentData(&userhandler);
  if (pDVar7 != document) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x761);
    abc1._7_1_ = false;
  }
  pDVar12 = myUserDataHandler::getCurrentSrc(&userhandler);
  if (pDVar12 != pDVar4) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x761);
    abc1._7_1_ = false;
  }
  pDVar12 = myUserDataHandler::getCurrentDst(&userhandler);
  if (pDVar12 != pDVar11) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x761);
    abc1._7_1_ = false;
  }
  (**(code **)(*(long *)(document + 0x18) + 0xe8))(document + 0x18,tempStr2,document,&userhandler);
  pDVar12 = (DOMNode *)(**(code **)(*(long *)document + 0x78))(document,pDVar4,1);
  DVar2 = myUserDataHandler::getCurrentType(&userhandler);
  if (DVar2 != NODE_IMPORTED) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x766)
    ;
    abc1._7_1_ = false;
  }
  pXVar10 = myUserDataHandler::getCurrentKey(&userhandler);
  iVar1 = xercesc_4_0::XMLString::compareString(pXVar10,tempStr2);
  if (iVar1 != 0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x766);
    abc1._7_1_ = false;
  }
  pDVar7 = (DOMDocument *)myUserDataHandler::getCurrentData(&userhandler);
  if (pDVar7 != document) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x766);
    abc1._7_1_ = false;
  }
  pDVar13 = myUserDataHandler::getCurrentSrc(&userhandler);
  if (pDVar13 != pDVar4) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x766);
    abc1._7_1_ = false;
  }
  pDVar13 = myUserDataHandler::getCurrentDst(&userhandler);
  if (pDVar13 != pDVar12) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x766);
    abc1._7_1_ = false;
  }
  (**(code **)(*(long *)pDVar12 + 0xe8))(pDVar12,tempStr2,pDVar4,&userhandler);
  (**(code **)(*(long *)pDVar12 + 0x138))();
  DVar2 = myUserDataHandler::getCurrentType(&userhandler);
  if (DVar2 != NODE_DELETED) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x76b)
    ;
    abc1._7_1_ = false;
  }
  pXVar10 = myUserDataHandler::getCurrentKey(&userhandler);
  iVar1 = xercesc_4_0::XMLString::compareString(pXVar10,tempStr2);
  if (iVar1 != 0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x76b);
    abc1._7_1_ = false;
  }
  pDVar12 = (DOMNode *)myUserDataHandler::getCurrentData(&userhandler);
  if (pDVar12 != pDVar4) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x76b);
    abc1._7_1_ = false;
  }
  pDVar12 = myUserDataHandler::getCurrentSrc(&userhandler);
  if (pDVar12 != (DOMNode *)0x0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x76b);
    abc1._7_1_ = false;
  }
  pDVar12 = myUserDataHandler::getCurrentDst(&userhandler);
  if (pDVar12 != (DOMNode *)0x0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x76b);
    abc1._7_1_ = false;
  }
  uVar14 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,pDVar4);
  if ((uVar14 & 1) == 0) {
    fprintf(_stderr,"isSameNode failed in line %i\n",0x76f);
    abc1._7_1_ = false;
  }
  local_2060 = (DOMDocument *)0x0;
  if (document != (DOMDocument *)0x0) {
    local_2060 = document + 0x18;
  }
  uVar14 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,local_2060);
  if ((uVar14 & 1) != 0) {
    fprintf(_stderr,"isSameNode failed in line %i\n",0x773);
    abc1._7_1_ = false;
  }
  uVar14 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar11);
  if ((uVar14 & 1) == 0) {
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x779);
    abc1._7_1_ = false;
  }
  uVar14 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar4);
  if ((uVar14 & 1) == 0) {
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x77e);
    abc1._7_1_ = false;
  }
  local_2078 = (DOMDocument *)0x0;
  if (document != (DOMDocument *)0x0) {
    local_2078 = document + 0x18;
  }
  uVar14 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,local_2078);
  if ((uVar14 & 1) != 0) {
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x782);
    abc1._7_1_ = false;
  }
  (**(code **)(*(long *)document + 0xf0))(document,pDVar4,0,tempStr2);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0xcd);
  if (abc1._7_1_ == false) {
    printf(
          "\n*****The DOMCharacterData method calls listed above failed, all others worked correctly.*****\n"
          );
  }
  (**(code **)(*(long *)pDVar4 + 0x178))(pDVar4,local_1f68);
  return abc1._7_1_;
}

Assistant:

bool DOMTest::testCharacterData(DOMDocument* document)
{
    DOMCharacterData* charData;
    XMLCh resetData[3999];
    bool OK = true;
// For debugging*****   printf("\n          testCharacterData's outputs:\n");
    XMLString::transcode("dBodyLevel31", tempStr, 3999);
    DOMNode*  abc1 = document->getDocumentElement()->getElementsByTagName(tempStr)->item(0)->getFirstChild(); // charData gets textNode11

    charData = (DOMCharacterData *) abc1;

    XMLString::transcode("dBodyLevel31'sChildTextNode11", tempStr, 3999);
    if (XMLString::compareString(tempStr, charData->getData()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'getData' failed to work properly!\n This may corrupt other DOMCharacterData tests!!!*****\n");
        OK = false;
    }

    XMLString::copyString(resetData,charData->getData());
    //  printf("This node's original data is: " + charData->getData());

    XMLString::transcode(" This is new data for this node", tempStr2, 3999);

    XMLString::copyString(tempStr, charData->getData());
    XMLString::catString(tempStr, tempStr2);

    charData->appendData(tempStr2);


    if (XMLString::compareString(tempStr, charData->getData()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'appendData' failed to work properly!\n");
        OK = false;
    }
    //  printf("This node's appended data is: " + charData->getData());

    XMLString::transcode("dBodyLevel", tempStr, 3999);
    charData->deleteData(10, 100);
    if (XMLString::compareString(tempStr, charData->getData()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'deleteData' failed to work properly!\n");
        OK = false;
    }
    //  printf("This node's partially deleted data is: " + charData->getData());

    XMLSize_t length = 10;
    if (!(length == charData->getLength()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'getLength' failed to work properly!\n");
        OK = false;
    }
    //  printf("This node's data length is: " + charData->getLength());

    XMLString::transcode("dBody' This is data inserted into this node'Level", tempStr, 3999);
    XMLString::transcode("' This is data inserted into this node'", tempStr2, 3999);
    charData->insertData(5, tempStr2);
    if (XMLString::compareString(tempStr, charData->getData()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'insertData' failed to work properly!\n");
        OK = false;
    }
    //  printf("This node's updated with insert data is: " + charData->getData());

    XMLString::transcode("dBody' This is ' replacement data'ted into this node'Level", tempStr, 3999);
    XMLString::transcode("' replacement data'", tempStr2, 3999);
    charData->replaceData(15, 10, tempStr2);
    if (XMLString::compareString(tempStr, charData->getData()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'replaceData' failed to work properly!\n");
        OK = false;
    }
    //  printf("This node's updated with replacement data is: " +charData->getData());

    XMLString::transcode("New data A123456789B123456789C123456789D123456789E123456789", tempStr, 3999);
    charData->setData(tempStr);
    if (XMLString::compareString(tempStr, charData->getData()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'setData' failed to work properly!");
        OK = false;
    }
    //  printf("This node's new data via setData: " + charData->getData());

    XMLString::transcode("123456789D123456789E123456789", tempStr, 3999);
    if (XMLString::compareString(tempStr, charData->substringData(30, 30)))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'substringData' failed to work properly!\n");
        OK = false;
    }
    //  printf("Using subString 30,30 you get:");  charData->substringData(30,30)).print();

    XMLString::transcode("New data A123456789B12345", tempStr, 3999);
    if (XMLString::compareString(tempStr, charData->substringData(0, 25)))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'substringData' failed to work properly!\n");
        OK = false;
    }
    //  printf("Using subString 0,25 you get: ");   charData->substringData(0,25)).print();

//************************************************* ERROR TESTS
    DOMTest tests;   // What is this for?  'tests' is never used.

//!! Throws INDEX_SIZE_ERR ********************
    EXCEPTIONSTEST(charData->deleteData((XMLSize_t)-1, 5), DOMException::INDEX_SIZE_ERR, OK, 101 );
    // Test 102 is not an error because the -1 parameter is an unsigned value, and counts
    //   that exceed the length of the string are allowed.
//    EXCEPTIONSTEST(charData->deleteData(2, -1), DOMException::INDEX_SIZE_ERR, OK, 102 );
    EXCEPTIONSTEST(charData->deleteData(100, 5), DOMException::INDEX_SIZE_ERR, OK,103 );

//can't set negative XMLSize_t in c++ compiler

  //  EXCEPTIONSTEST(charData->insertData(-1, "Stuff inserted"), DOMException::INDEX_SIZE_ERR, OK, 104 );
    XMLString::transcode("Stuff inserted", tempStr, 3999);
    EXCEPTIONSTEST(charData->insertData(100, tempStr), DOMException::INDEX_SIZE_ERR, OK, 105 );

  //  EXCEPTIONSTEST(charData->replaceData(-1, 5, "Replacement stuff") , DOMException::INDEX_SIZE_ERR, OK, 106 );
    XMLString::transcode("Replacement stuff", tempStr, 3999);
    EXCEPTIONSTEST(charData->replaceData(100, 5 ,tempStr), DOMException::INDEX_SIZE_ERR, OK, 107 );
  //  EXCEPTIONSTEST(charData->replaceData(2, -1, "Replacement stuff"), DOMException::INDEX_SIZE_ERR,  OK, 108 );

    EXCEPTIONSTEST(charData->substringData((XMLSize_t)-1, 5), DOMException::INDEX_SIZE_ERR, OK, 109 );
    EXCEPTIONSTEST(charData->substringData(100, 5), DOMException::INDEX_SIZE_ERR, OK, 110 );
 //   EXCEPTIONSTEST(charData->substringData(2, -1), DOMException::INDEX_SIZE_ERR, OK, 111 );


    // Test the user data
    // Test simple set and get
    DOMCharacterData* userTest = charData;
    DOMDocument*  userFirst = document;
    XMLCh* userSecond = tempStr2;
    XMLString::transcode("first", tempStr, 3999);

    XMLString::transcode("document", tempStr2, 3999);
    userTest->setUserData(tempStr2, (void*) document, 0);
    void* mydocument = userTest->getUserData(tempStr2);
    if (document != mydocument) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    userTest->setUserData(tempStr, (void*) userFirst, 0);
    void* myFirst = userTest->getUserData(tempStr);
    if (userFirst != myFirst) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test overwrite
    void* myFirst2 = userTest->setUserData(tempStr, (void*) userSecond, 0);
    void* mySecond = userTest->getUserData(tempStr);
    if (userSecond != mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst != myFirst2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst == mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test null
    // test non-exist key
    XMLString::transcode("not-exist", tempStr3, 3999);
    if (userTest->getUserData(tempStr3)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // use a node that does not have user data set before
    if (userFirst->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test reset
    void* mySecond2 = userTest->setUserData(tempStr, (void*) 0, 0);
    void* myNull = userTest->getUserData(tempStr);
    if (userSecond != mySecond2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    void* mydocument2 = userTest->setUserData(tempStr2, (void*) 0, 0);
    void* myNull2 = userTest->getUserData(tempStr2);
    if (mydocument != mydocument2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    //the userTest user data table should be null now
    if (userTest->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userTest->getUserData(tempStr2)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test DOMUserDataHandler
    // test clone
    userTest->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* mycloned = userTest->cloneNode(true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_CLONED, tempStr2, document, userTest, mycloned, __LINE__);

    // test import
    document->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* myimport = document->importNode(userTest,true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_IMPORTED, tempStr2, document, userTest, myimport, __LINE__);

    // test delete
    myimport->setUserData(tempStr2, (void*) userTest, &userhandler);
    myimport->release();
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_DELETED, tempStr2, userTest, 0, 0, __LINE__);

    // Test isSameNode
    if (!userTest->isSameNode(userTest)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isSameNode(userFirst)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test isEqualNode
    if (!userTest->isEqualNode(mycloned)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    if (!userTest->isEqualNode(userTest)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isEqualNode(userFirst)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test rename, should throw exception
    EXCEPTIONSTEST(document->renameNode(userTest, 0, tempStr2), DOMException::NOT_SUPPORTED_ERR, OK, 205 );

    if (!OK)
        printf("\n*****The DOMCharacterData method calls listed above failed, all others worked correctly.*****\n");
    charData->setData(resetData); // reset node to original data
    return OK;
}